

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O0

void __thiscall MipsGenerator::TranslateADD(MipsGenerator *this,Pcode *item)

{
  int iVar1;
  char *pcVar2;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  string local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  int local_108;
  allocator local_101;
  int value;
  int local_e0;
  allocator local_d9;
  int ret3;
  int local_b8;
  allocator local_b1;
  int ret2;
  int local_8c;
  undefined1 local_88 [4];
  int ret1;
  string num3;
  undefined1 local_58 [8];
  string num2;
  string num1;
  Pcode *item_local;
  MipsGenerator *this_local;
  
  Pcode::GetNum1_abi_cxx11_((string *)((long)&num2.field_2 + 8),item);
  Pcode::GetNum2_abi_cxx11_((string *)local_58,item);
  Pcode::GetNum3_abi_cxx11_((string *)local_88,item);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&ret2,"$25",&local_b1);
  iVar1 = PrepareStoreREG(this,(string *)((long)&num2.field_2 + 8),&reg1_abi_cxx11_,(string *)&ret2)
  ;
  std::__cxx11::string::~string((string *)&ret2);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_8c = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&ret3,"$26",&local_d9);
  iVar1 = PrepareLoadREG(this,(string *)local_58,&reg2_abi_cxx11_,(string *)&ret3);
  std::__cxx11::string::~string((string *)&ret3);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  local_b8 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&value,"$27",&local_101);
  iVar1 = PrepareLoadREG(this,(string *)local_88,&reg3_abi_cxx11_,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  local_e0 = iVar1;
  if ((local_b8 == -1) && (iVar1 == -1)) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = atoi(pcVar2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    local_108 = atoi(pcVar2);
    local_108 = iVar1 + local_108;
    std::operator+(&local_168,"li ",&reg1_abi_cxx11_);
    std::operator+(&local_148,&local_168," ");
    std::__cxx11::to_string(&local_188,local_108);
    std::operator+(&local_128,&local_148,&local_188);
    Output2File(this,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
  }
  else if (local_b8 == -1) {
    std::operator+(&local_228,"addiu ",&reg1_abi_cxx11_);
    std::operator+(&local_208,&local_228," ");
    std::operator+(&local_1e8,&local_208,&reg3_abi_cxx11_);
    std::operator+(&local_1c8,&local_1e8," ");
    std::operator+(&local_1a8,&local_1c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    Output2File(this,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
  }
  else if (iVar1 == -1) {
    std::operator+(&local_2c8,"addiu ",&reg1_abi_cxx11_);
    std::operator+(&local_2a8,&local_2c8," ");
    std::operator+(&local_288,&local_2a8,&reg2_abi_cxx11_);
    std::operator+(&local_268,&local_288," ");
    std::operator+(&local_248,&local_268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    Output2File(this,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  else {
    std::operator+(&local_368,"addu ",&reg1_abi_cxx11_);
    std::operator+(&local_348,&local_368," ");
    std::operator+(&local_328,&local_348,&reg2_abi_cxx11_);
    std::operator+(&local_308,&local_328," ");
    std::operator+(&local_2e8,&local_308,&reg3_abi_cxx11_);
    Output2File(this,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
  }
  if (local_8c == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_388,"",&local_389);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"t",&local_3b1);
    GenerateStore(this,&reg1_abi_cxx11_,(string *)((long)&num2.field_2 + 8),&local_388,&local_3b0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    std::__cxx11::string::~string((string *)&local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
  }
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(num2.field_2._M_local_buf + 8));
  return;
}

Assistant:

void MipsGenerator::TranslateADD(Pcode& item) {
    string num1 = item.GetNum1();
    string num2 = item.GetNum2();
    string num3 = item.GetNum3();
    int ret1 = PrepareStoreREG(num1, reg1, NUM1);
    int ret2 = PrepareLoadREG(num2, reg2, NUM2);
    int ret3 = PrepareLoadREG(num3, reg3, NUM3);
    if (ret2 == -1 && ret3 == -1) {
        int value = atoi(num2.c_str()) + atoi(num3.c_str());
        Output2File("li " + reg1 + " " + std::to_string(value));
    } else if (ret2 == -1) {
        Output2File("addiu " + reg1 + " " + reg3 + " " + num2);
    } else if (ret3 == -1) {
        Output2File("addiu " + reg1 + " " + reg2 + " " + num3);
    } else {
        Output2File("addu " + reg1 + " " + reg2 + " " + reg3);
    }
    if (ret1 == 1) {
        GenerateStore(reg1, num1, "", TMP);
    }
}